

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O3

float __thiscall MT32Emu::LA32FloatPartialPair::nextOutSample(LA32FloatPartialPair *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = this->masterOutputSample;
  if (this->ringModulated == false) {
    fVar2 = fVar1 + this->slaveOutputSample;
    goto LAB_0011fa71;
  }
  if (-1.0 <= fVar1) {
    fVar2 = fVar1;
    if (1.0 < fVar1) {
      fVar2 = -2.0;
      goto LAB_0011fa3a;
    }
  }
  else {
    fVar2 = 2.0;
LAB_0011fa3a:
    fVar2 = fVar2 + fVar1;
  }
  fVar3 = this->slaveOutputSample;
  if (-1.0 <= fVar3) {
    if (1.0 < fVar3) {
      fVar3 = fVar3 + -2.0;
    }
  }
  else {
    fVar3 = fVar3 + 2.0;
  }
  fVar2 = fVar2 * fVar3;
  if (this->mixed != false) {
    fVar2 = fVar2 + fVar1;
  }
LAB_0011fa71:
  return fVar2 * 0.25;
}

Assistant:

float LA32FloatPartialPair::nextOutSample() {
	// Note, LA32FloatWaveGenerator produces each sample normalised in terms of a single playing partial,
	// so the unity sample corresponds to the internal LA32 logarithmic fixed-point unity sample.
	// However, each logarithmic sample is then unlogged to a 14-bit signed integer value, i.e. the max absolute value is 8192.
	// Thus, considering that samples are further mapped to a 16-bit signed integer,
	// we apply a conversion factor 0.25 to produce properly normalised float samples.
	if (!ringModulated) {
		return 0.25f * (masterOutputSample + slaveOutputSample);
	}
	/*
	 * SEMI-CONFIRMED: Ring modulation model derived from sample analysis of specially constructed patches which exploit distortion.
	 * LA32 ring modulator found to produce distorted output in case if the absolute value of maximal amplitude of one of the input partials exceeds 8191.
	 * This is easy to reproduce using synth partials with resonance values close to the maximum. It looks like an integer overflow happens in this case.
	 * As the distortion is strictly bound to the amplitude of the complete mixed square + resonance wave in the linear space,
	 * it is reasonable to assume the ring modulation is performed also in the linear space by sample multiplication.
	 * Most probably the overflow is caused by limited precision of the multiplication circuit as the very similar distortion occurs with panning.
	 */
	float ringModulatedSample = produceDistortedSample(masterOutputSample) * produceDistortedSample(slaveOutputSample);
	return 0.25f * (mixed ? masterOutputSample + ringModulatedSample : ringModulatedSample);
}